

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

size_t fio_local_addr(char *dest,size_t limit)

{
  int iVar1;
  addrinfo *local_68;
  size_t len;
  addrinfo *pos;
  addrinfo *info;
  addrinfo hints;
  size_t limit_local;
  char *dest_local;
  
  hints.ai_next = (addrinfo *)limit;
  iVar1 = gethostname(dest,limit);
  if (iVar1 == 0) {
    memset(&info,0,0x30);
    info._4_4_ = 0;
    hints.ai_flags = 1;
    info._0_4_ = 2;
    iVar1 = getaddrinfo(dest,"http",(addrinfo *)&info,(addrinfo **)&pos);
    if (iVar1 == 0) {
      for (len = (size_t)pos; len != 0; len = *(size_t *)(len + 0x28)) {
        if (*(long *)(len + 0x20) != 0) {
          local_68 = (addrinfo *)strlen(*(char **)(len + 0x20));
          if (hints.ai_next <= local_68) {
            local_68 = (addrinfo *)((long)&hints.ai_next[-1].ai_next + 7);
          }
          memcpy(dest,*(void **)(len + 0x20),(size_t)local_68);
          dest[(long)local_68] = '\0';
          freeaddrinfo((addrinfo *)pos);
          return (size_t)local_68;
        }
      }
      freeaddrinfo((addrinfo *)pos);
    }
  }
  return 0;
}

Assistant:

size_t fio_local_addr(char *dest, size_t limit) {
  if (gethostname(dest, limit))
    return 0;

  struct addrinfo hints, *info;
  memset(&hints, 0, sizeof hints);
  hints.ai_family = AF_UNSPEC;     // don't care IPv4 or IPv6
  hints.ai_socktype = SOCK_STREAM; // TCP stream sockets
  hints.ai_flags = AI_CANONNAME;   // get cannonical name

  if (getaddrinfo(dest, "http", &hints, &info) != 0)
    return 0;

  for (struct addrinfo *pos = info; pos; pos = pos->ai_next) {
    if (pos->ai_canonname) {
      size_t len = strlen(pos->ai_canonname);
      if (len >= limit)
        len = limit - 1;
      memcpy(dest, pos->ai_canonname, len);
      dest[len] = 0;
      freeaddrinfo(info);
      return len;
    }
  }

  freeaddrinfo(info);
  return 0;
}